

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void biflog(bifcxdef *ctx,int argc)

{
  long lVar1;
  long in_RDI;
  uchar *str;
  char buf [4096];
  undefined8 in_stack_ffffffffffffefd8;
  tiocxdef *ctx_00;
  runcxdef *in_stack_ffffffffffffefe0;
  uchar *in_stack_ffffffffffffeff8;
  size_t in_stack_fffffffffffff000;
  char *in_stack_fffffffffffff008;
  bifcxdef *in_stack_fffffffffffff010;
  
  if (*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\x05') {
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = *(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10;
    tiologcls((tiocxdef *)0x267138);
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x03') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign(in_stack_ffffffffffffefe0,(int)((ulong)in_stack_ffffffffffffefd8 >> 0x20));
    }
    ctx_00 = *(tiocxdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    bifcstr(in_stack_fffffffffffff010,in_stack_fffffffffffff008,in_stack_fffffffffffff000,
            in_stack_ffffffffffffeff8);
    tiologopn(ctx_00,(char *)0x2671e3);
  }
  return;
}

Assistant:

void biflog(bifcxdef *ctx, int argc)
{
    char   buf[OSFNMAX];
    uchar *str;
    
    bifcntargs(ctx, 1, argc);
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        tiologcls(ctx->bifcxtio);
    }
    else
    {
        str = runpopstr(ctx->bifcxrun);
        bifcstr(ctx, buf, (size_t)sizeof(buf), str);
        tiologopn(ctx->bifcxtio, buf);
    }
}